

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniOutputDefault_Test::~TApp_IniOutputDefault_Test(TApp_IniOutputDefault_Test *this)

{
  TApp_IniOutputDefault_Test *this_local;
  
  ~TApp_IniOutputDefault_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniOutputDefault) {

    int v = 7;
    app.add_option("--simple", v, "", true);

    run();

    std::string str = app.config_to_str();
    EXPECT_THAT(str, Not(HasSubstr("simple=7")));

    str = app.config_to_str(true);
    EXPECT_THAT(str, HasSubstr("simple=7"));
}